

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O3

Entry * __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
::_pop_pivot(Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
             *this)

{
  pointer *pppEVar1;
  Entry *pEVar2;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar3;
  pointer ppEVar4;
  pointer ppEVar5;
  pointer ppEVar6;
  
  ppEVar6 = (this->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    ppEVar4 = (this->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar6 == ppEVar4) {
      return (Entry *)0x0;
    }
    pEVar2 = *ppEVar6;
    if (8 < (long)ppEVar4 - (long)ppEVar6) {
      pEVar3 = ppEVar4[-1];
      ppEVar4[-1] = pEVar2;
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>>,long,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>::EntryPointerComp>>
                (ppEVar6,0,(long)ppEVar4 + (-8 - (long)ppEVar6) >> 3,pEVar3);
      ppEVar6 = (this->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 = (this->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    ppEVar5 = ppEVar4 + -1;
    (this->column_).
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar5;
    if (ppEVar6 == ppEVar5) break;
    if ((*ppEVar6)->rowIndex_ != pEVar2->rowIndex_) {
      return pEVar2;
    }
    if (8 < (long)ppEVar5 - (long)ppEVar6) {
      pEVar3 = ppEVar4[-2];
      ppEVar4[-2] = *ppEVar6;
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>>,long,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>::EntryPointerComp>>
                (ppEVar6,0,(long)ppEVar4 + (-0x10 - (long)ppEVar6) >> 3,pEVar3);
      ppEVar5 = (this->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    operator_delete(ppEVar5[-1],4);
    pppEVar1 = &(this->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + -1;
    operator_delete(pEVar2,4);
    ppEVar6 = (this->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  return pEVar2;
}

Assistant:

inline typename Heap_column<Master_matrix>::Entry* Heap_column<Master_matrix>::_pop_pivot()
{
  if (column_.empty()) {
    return nullptr;
  }

  Entry* pivot = column_.front();
  std::pop_heap(column_.begin(), column_.end(), entryPointerComp_);
  column_.pop_back();
  if constexpr (Master_matrix::Option_list::is_z2) {
    while (!column_.empty() && column_.front()->get_row_index() == pivot->get_row_index()) {
      std::pop_heap(column_.begin(), column_.end(), entryPointerComp_);
      entryPool_->destroy(column_.back());
      column_.pop_back();

      entryPool_->destroy(pivot);
      if (column_.empty()) {
        return nullptr;
      }
      pivot = column_.front();
      std::pop_heap(column_.begin(), column_.end(), entryPointerComp_);
      column_.pop_back();
    }
  } else {
    while (!column_.empty() && column_.front()->get_row_index() == pivot->get_row_index()) {
      operators_->add_inplace(pivot->get_element(), column_.front()->get_element());
      std::pop_heap(column_.begin(), column_.end(), entryPointerComp_);
      entryPool_->destroy(column_.back());
      column_.pop_back();
    }

    if (pivot->get_element() == Field_operators::get_additive_identity()) {
      entryPool_->destroy(pivot);
      return _pop_pivot();
    }
  }

  return pivot;
}